

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_relation.cpp
# Opt level: O2

void __thiscall
duckdb::ViewRelation::ViewRelation
          (ViewRelation *this,shared_ptr<duckdb::RelationContextWrapper,_true> *context,
          string *schema_name_p,string *view_name_p)

{
  allocator local_49;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,anon_var_dwarf_3b2a81b + 9,&local_49);
  Relation::Relation(&this->super_Relation,context,VIEW_RELATION,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__ViewRelation_027ba410;
  ::std::__cxx11::string::string((string *)&this->schema_name,(string *)schema_name_p);
  ::std::__cxx11::string::string((string *)&this->view_name,(string *)view_name_p);
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->premade_tableref).
  super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Relation::TryBindRelation(&this->super_Relation,&this->columns);
  return;
}

Assistant:

ViewRelation::ViewRelation(const shared_ptr<RelationContextWrapper> &context, string schema_name_p, string view_name_p)
    : Relation(context, RelationType::VIEW_RELATION), schema_name(std::move(schema_name_p)),
      view_name(std::move(view_name_p)) {
	TryBindRelation(columns);
}